

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsExecutionServer.cpp
# Opt level: O1

TestDriver * __thiscall xs::ExecutionServer::acquireTestDriver(ExecutionServer *this)

{
  deBool dVar1;
  runtime_error *this_00;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  dVar1 = deMutex_tryLock((this->m_testDriverLock).m_mutex);
  if (dVar1 == 1) {
    return &this->m_testDriver;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Failed to acquire test driver","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_0012b4c0;
  __cxa_throw(this_00,&Error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TestDriver* ExecutionServer::acquireTestDriver (void)
{
	if (!m_testDriverLock.tryLock())
		throw Error("Failed to acquire test driver");

	return &m_testDriver;
}